

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O0

void AddSingleLiteralWithCostModel
               (uint32_t *argb,VP8LColorCache *hashers,CostModel *cost_model,int idx,
               int use_color_cache,int64_t prev_cost,int64_t *cost,uint16_t *dist_array)

{
  uint32_t v;
  uint32_t idx_00;
  int64_t iVar1;
  int in_ECX;
  CostModel *in_RDX;
  long in_RDI;
  int in_R8D;
  long in_R9;
  long in_stack_00000008;
  int ix;
  uint32_t color;
  int64_t cost_val;
  uint32_t in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined8 local_30;
  
  v = *(uint32_t *)(in_RDI + (long)in_ECX * 4);
  if (in_R8D == 0) {
    idx_00 = 0xffffffff;
  }
  else {
    idx_00 = VP8LColorCacheContains
                       ((VP8LColorCache *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc);
  }
  if ((int)idx_00 < 0) {
    if (in_R8D != 0) {
      VP8LColorCacheInsert
                ((VP8LColorCache *)CONCAT44(idx_00,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffbc);
    }
    iVar1 = GetLiteralCost(in_RDX,v);
    local_30 = DivRound(iVar1 * 0x52,100);
  }
  else {
    iVar1 = GetCacheCost(in_RDX,idx_00);
    local_30 = DivRound(iVar1 * 0x44,100);
  }
  local_30 = local_30 + in_R9;
  if (local_30 < *(long *)(in_stack_00000008 + (long)in_ECX * 8)) {
    *(long *)(in_stack_00000008 + (long)in_ECX * 8) = local_30;
    *(undefined2 *)(_ix + (long)in_ECX * 2) = 1;
  }
  return;
}

Assistant:

static WEBP_INLINE void AddSingleLiteralWithCostModel(
    const uint32_t* const argb, VP8LColorCache* const hashers,
    const CostModel* const cost_model, int idx, int use_color_cache,
    int64_t prev_cost, int64_t* const cost, uint16_t* const dist_array) {
  int64_t cost_val = prev_cost;
  const uint32_t color = argb[idx];
  const int ix = use_color_cache ? VP8LColorCacheContains(hashers, color) : -1;
  if (ix >= 0) {
    // use_color_cache is true and hashers contains color
    cost_val += DivRound(GetCacheCost(cost_model, ix) * 68, 100);
  } else {
    if (use_color_cache) VP8LColorCacheInsert(hashers, color);
    cost_val += DivRound(GetLiteralCost(cost_model, color) * 82, 100);
  }
  if (cost[idx] > cost_val) {
    cost[idx] = cost_val;
    dist_array[idx] = 1;  // only one is inserted.
  }
}